

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcEncrypt.c
# Opt level: O1

void encryptInPlace(ThreefishKey_t *key,uint64_t *chain,uint64_t *plain_text,uint64_t num_blocks)

{
  u64b_t uVar1;
  undefined1 *puVar2;
  ulong uVar3;
  
  uVar1 = key->stateSize;
  if (uVar1 == 0x400) {
    *plain_text = *plain_text ^ *chain;
    plain_text[1] = plain_text[1] ^ chain[1];
    plain_text[2] = plain_text[2] ^ chain[2];
    plain_text[3] = plain_text[3] ^ chain[3];
    plain_text[4] = plain_text[4] ^ chain[4];
    plain_text[5] = plain_text[5] ^ chain[5];
    plain_text[6] = plain_text[6] ^ chain[6];
    plain_text[7] = plain_text[7] ^ chain[7];
    plain_text[8] = plain_text[8] ^ chain[8];
    plain_text[9] = plain_text[9] ^ chain[9];
    plain_text[10] = plain_text[10] ^ chain[10];
    plain_text[0xb] = plain_text[0xb] ^ chain[0xb];
    plain_text[0xc] = plain_text[0xc] ^ chain[0xc];
    plain_text[0xd] = plain_text[0xd] ^ chain[0xd];
    plain_text[0xe] = plain_text[0xe] ^ chain[0xe];
    plain_text[0xf] = plain_text[0xf] ^ chain[0xf];
    if (num_blocks << 4 != 0) {
      uVar3 = 0;
      do {
        if (uVar3 != 0) {
          *plain_text = *plain_text ^ plain_text[-0x10];
          plain_text[1] = plain_text[1] ^ plain_text[-0xf];
          plain_text[2] = plain_text[2] ^ plain_text[-0xe];
          plain_text[3] = plain_text[3] ^ plain_text[-0xd];
          plain_text[4] = plain_text[4] ^ plain_text[-0xc];
          plain_text[5] = plain_text[5] ^ plain_text[-0xb];
          plain_text[6] = plain_text[6] ^ plain_text[-10];
          plain_text[7] = plain_text[7] ^ plain_text[-9];
          plain_text[8] = plain_text[8] ^ plain_text[-8];
          plain_text[9] = plain_text[9] ^ plain_text[-7];
          plain_text[10] = plain_text[10] ^ plain_text[-6];
          plain_text[0xb] = plain_text[0xb] ^ plain_text[-5];
          plain_text[0xc] = plain_text[0xc] ^ plain_text[-4];
          plain_text[0xd] = plain_text[0xd] ^ plain_text[-3];
          plain_text[0xe] = plain_text[0xe] ^ plain_text[-2];
          plain_text[0xf] = plain_text[0xf] ^ plain_text[-1];
        }
        threefishEncryptBlockWords(key,plain_text,plain_text);
        uVar3 = uVar3 + 0x10;
        plain_text = plain_text + 0x10;
      } while (uVar3 < num_blocks << 4);
    }
    return;
  }
  if (uVar1 != 0x200) {
    if (uVar1 == 0x100) {
      cbc256Encrypt(key,chain,plain_text,num_blocks);
      return;
    }
    encryptInPlace_cold_1();
    puVar2 = (undefined1 *)calloc(1,0x18);
    *puVar2 = 0xff;
    *(undefined8 *)(puVar2 + 8) = 0;
    *(undefined8 *)(puVar2 + 0x10) = 0;
    return;
  }
  *plain_text = *plain_text ^ *chain;
  plain_text[1] = plain_text[1] ^ chain[1];
  plain_text[2] = plain_text[2] ^ chain[2];
  plain_text[3] = plain_text[3] ^ chain[3];
  plain_text[4] = plain_text[4] ^ chain[4];
  plain_text[5] = plain_text[5] ^ chain[5];
  plain_text[6] = plain_text[6] ^ chain[6];
  plain_text[7] = plain_text[7] ^ chain[7];
  if (num_blocks << 3 != 0) {
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        *plain_text = *plain_text ^ plain_text[-8];
        plain_text[1] = plain_text[1] ^ plain_text[-7];
        plain_text[2] = plain_text[2] ^ plain_text[-6];
        plain_text[3] = plain_text[3] ^ plain_text[-5];
        plain_text[4] = plain_text[4] ^ plain_text[-4];
        plain_text[5] = plain_text[5] ^ plain_text[-3];
        plain_text[6] = plain_text[6] ^ plain_text[-2];
        plain_text[7] = plain_text[7] ^ plain_text[-1];
      }
      threefishEncryptBlockWords(key,plain_text,plain_text);
      uVar3 = uVar3 + 8;
      plain_text = plain_text + 8;
    } while (uVar3 < num_blocks << 3);
  }
  return;
}

Assistant:

void encryptInPlace(ThreefishKey_t* key,
                    const uint64_t* chain,
                    uint64_t* plain_text,
                    const uint64_t num_blocks)
{
    pd2("encryptInPlace(key:%lu, chain:%lu, plain_text:%lu, num_blocks:%lu)\n",
        key->key[0],
        chain[0],
        plain_text[0],
        num_blocks);

    switch(key->stateSize) //call the corresponding cbc Encrypt function
    {
        case 256: cbc256Encrypt(key, chain, plain_text, num_blocks);
        break;
        case 512: cbc512Encrypt(key, chain, plain_text, num_blocks);
        break;
        case 1024: cbc1024Encrypt(key, chain, plain_text, num_blocks);
        break;
        default:
        {
            perror("Invalid state size cannot continue\n");
            exit(9);
        }
        break;
    }
}